

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O3

RealType __thiscall
OpenMD::GofROmega::evaluateAngle(GofROmega *this,StuntDouble *sd1,StuntDouble *sd2,StuntDouble *sd3)

{
  double *pdVar1;
  double dVar2;
  char cVar3;
  bool bVar4;
  uint i_5;
  ObjectType OVar5;
  double **ppdVar6;
  long lVar7;
  long lVar8;
  double **ppdVar9;
  double (*padVar10) [3];
  double tmp;
  double dVar11;
  Vector<double,_3U> result_2;
  Vector3d v2;
  Vector<double,_3U> result;
  MultipoleAdapter ma2;
  double local_118 [4];
  double local_f8 [4];
  Vector3d local_d8;
  double *local_b8;
  double dStack_b0;
  double local_a8 [7];
  MultipoleAdapter local_70;
  double local_68 [10];
  
  cVar3 = (((this->super_GofRAngle).super_RadialDistrFunc.super_StaticAnalyser.info_)->simParams_->
          UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  lVar8 = 0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  lVar7 = *(long *)((long)&(sd3->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd3->storage_);
  local_68[2] = *(double *)(lVar7 + 0x10 + (long)sd3->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)sd3->localIndex_ * 0x18);
  local_68[0] = *pdVar1;
  local_68[1] = pdVar1[1];
  lVar7 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
  local_118[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)sd1->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar7 + (long)sd1->localIndex_ * 0x18);
  local_118[0] = *pdVar1;
  local_118[1] = pdVar1[1];
  local_b8 = (double *)0x0;
  dStack_b0 = 0.0;
  local_a8[0] = 0.0;
  do {
    (&local_b8)[lVar8] = (double *)(local_68[lVar8] - local_118[lVar8]);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_d8.super_Vector<double,_3U>.data_[2] = local_a8[0];
  local_d8.super_Vector<double,_3U>.data_[0] = (double)local_b8;
  local_d8.super_Vector<double,_3U>.data_[1] = dStack_b0;
  if (cVar3 != '\0') {
    Snapshot::wrapVector((this->super_GofRAngle).super_RadialDistrFunc.currentSnapshot_,&local_d8);
  }
  OVar5 = sd2->objType_;
  if (1 < OVar5 - otDAtom) {
    (*sd2->_vptr_StuntDouble[7])(&local_b8,sd2);
    snprintf(painCave.errMsg,2000,"GofROmega: attempted to use a non-directional object: %s\n");
    if (local_b8 != local_a8) {
      operator_delete(local_b8,(long)local_a8[0] + 1);
    }
    painCave.isFatal = 1;
    simError();
    OVar5 = sd2->objType_;
  }
  if (OVar5 < otRigidBody) {
    local_70.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    bVar4 = MultipoleAdapter::isDipole(&local_70);
    if (bVar4) {
      lVar7 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
      local_f8[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)sd2->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar7 + (long)sd2->localIndex_ * 0x18);
      local_f8[0] = *pdVar1;
      local_f8[1] = pdVar1[1];
      goto LAB_00138ce5;
    }
    padVar10 = (double (*) [3])local_68;
    StuntDouble::getA((RotMat3x3d *)padVar10,sd2);
    ppdVar6 = &local_b8;
    local_a8[4] = 0.0;
    local_a8[5] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_b8 = (double *)0x0;
    dStack_b0 = 0.0;
    local_a8[6] = 0.0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      ppdVar9 = ppdVar6;
      do {
        *ppdVar9 = (double *)
                   (((SquareMatrix<double,_3> *)*padVar10)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar8];
        lVar8 = lVar8 + 1;
        ppdVar9 = ppdVar9 + 3;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      ppdVar6 = ppdVar6 + 1;
      padVar10 = padVar10 + 1;
    } while (lVar7 != 3);
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    ppdVar6 = &local_b8;
    lVar7 = 0;
    do {
      dVar11 = local_118[lVar7];
      lVar8 = 0;
      do {
        dVar11 = dVar11 + *(double *)((long)ppdVar6 + lVar8) *
                          *(double *)((long)&OpenMD::V3Z + lVar8);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x18);
      local_118[lVar7] = dVar11;
      lVar7 = lVar7 + 1;
      ppdVar6 = ppdVar6 + 3;
    } while (lVar7 != 3);
  }
  else {
    padVar10 = (double (*) [3])local_68;
    StuntDouble::getA((RotMat3x3d *)padVar10,sd2);
    ppdVar6 = &local_b8;
    local_a8[4] = 0.0;
    local_a8[5] = 0.0;
    local_a8[2] = 0.0;
    local_a8[3] = 0.0;
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_b8 = (double *)0x0;
    dStack_b0 = 0.0;
    local_a8[6] = 0.0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      ppdVar9 = ppdVar6;
      do {
        *ppdVar9 = (double *)
                   (((SquareMatrix<double,_3> *)*padVar10)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar8];
        lVar8 = lVar8 + 1;
        ppdVar9 = ppdVar9 + 3;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      ppdVar6 = ppdVar6 + 1;
      padVar10 = padVar10 + 1;
    } while (lVar7 != 3);
    local_118[0] = 0.0;
    local_118[1] = 0.0;
    local_118[2] = 0.0;
    ppdVar6 = &local_b8;
    lVar7 = 0;
    do {
      dVar11 = local_118[lVar7];
      lVar8 = 0;
      do {
        dVar11 = dVar11 + *(double *)((long)ppdVar6 + lVar8) *
                          *(double *)((long)&OpenMD::V3Z + lVar8);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x18);
      local_118[lVar7] = dVar11;
      lVar7 = lVar7 + 1;
      ppdVar6 = ppdVar6 + 3;
    } while (lVar7 != 3);
  }
  local_f8[2] = local_118[2];
  local_f8[0] = local_118[0];
  local_f8[1] = local_118[1];
LAB_00138ce5:
  dVar11 = 0.0;
  lVar7 = 0;
  do {
    dVar2 = local_d8.super_Vector<double,_3U>.data_[lVar7];
    dVar11 = dVar11 + dVar2 * dVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  lVar7 = 0;
  do {
    local_d8.super_Vector<double,_3U>.data_[lVar7] =
         local_d8.super_Vector<double,_3U>.data_[lVar7] / dVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar11 = 0.0;
  lVar7 = 0;
  do {
    dVar11 = dVar11 + local_f8[lVar7] * local_f8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  lVar7 = 0;
  do {
    local_f8[lVar7] = local_f8[lVar7] / dVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar11 = 0.0;
  lVar7 = 0;
  do {
    dVar11 = dVar11 + local_d8.super_Vector<double,_3U>.data_[lVar7] * local_f8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return dVar11;
}

Assistant:

RealType GofROmega::evaluateAngle(StuntDouble* sd1, StuntDouble* sd2,
                                    StuntDouble* sd3) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d v1;
    Vector3d v2;

    v1 = sd3->getPos() - sd1->getPos();
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(v1);

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofROmega: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (sd2->isAtom()) {
      AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
      MultipoleAdapter ma2 = MultipoleAdapter(atype2);

      if (ma2.isDipole())
        v2 = sd2->getDipole();
      else
        v2 = sd2->getA().transpose() * V3Z;
    } else {
      v2 = sd2->getA().transpose() * V3Z;
    }

    v1.normalize();
    v2.normalize();
    return dot(v1, v2);
  }